

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl
          (PipelineResourceSignatureVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pDevice,PipelineResourceSignatureDesc *Desc,
          PipelineResourceSignatureInternalDataVk *InternalData)

{
  PipelineResourceSignatureInternalDataVk *Serialized;
  PipelineResourceSignatureInternalDataVk *Desc_00;
  IMemoryAllocator *RawAllocator;
  anon_class_8_1_8991fb9c local_90;
  function<unsigned_long_()> local_88;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  PipelineResourceSignatureInternalDataVk *local_30;
  PipelineResourceSignatureInternalDataVk *InternalData_local;
  PipelineResourceSignatureDesc *Desc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  PipelineResourceSignatureVkImpl *this_local;
  
  local_30 = InternalData;
  InternalData_local = (PipelineResourceSignatureInternalDataVk *)Desc;
  Desc_local = (PipelineResourceSignatureDesc *)pDevice;
  pDevice_local = (RenderDeviceVkImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::PipelineResourceSignatureBase
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pDevice,Desc,InternalData);
  (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  .super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_010d2008;
  std::
  array<VulkanUtilities::VulkanObjectWrapper<VkDescriptorSetLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)15>,_2UL>
  ::array(&this->m_VkDescrSetLayouts);
  (this->m_DescriptorSetSizes)._M_elems[0] = 0xffffffff;
  (this->m_DescriptorSetSizes)._M_elems[1] = 0xffffffff;
  this->m_DynamicUniformBufferCount = 0;
  this->m_DynamicStorageBufferCount = 0;
  RawAllocator = GetRawAllocator();
  Desc_00 = InternalData_local;
  Serialized = local_30;
  local_68.this = this;
  std::function<void()>::
  function<Diligent::PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureInternalDataVk_const&)::__0,void>
            ((function<void()> *)&local_60,&local_68);
  local_90.this = this;
  std::function<unsigned_long()>::
  function<Diligent::PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl(Diligent::IReferenceCounters*,Diligent::RenderDeviceVkImpl*,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureInternalDataVk_const&)::__1,void>
            ((function<unsigned_long()> *)&local_88,&local_90);
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
  Deserialize<Diligent::PipelineResourceSignatureInternalDataVk>
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,RawAllocator,
             (PipelineResourceSignatureDesc *)Desc_00,Serialized,true,&local_60,&local_88);
  std::function<unsigned_long_()>::~function(&local_88);
  std::function<void_()>::~function(&local_60);
  return;
}

Assistant:

PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl(IReferenceCounters*                            pRefCounters,
                                                                 RenderDeviceVkImpl*                            pDevice,
                                                                 const PipelineResourceSignatureDesc&           Desc,
                                                                 const PipelineResourceSignatureInternalDataVk& InternalData) :
    TPipelineResourceSignatureBase{pRefCounters, pDevice, Desc, InternalData}
{
    try
    {
        Deserialize(
            GetRawAllocator(), Desc, InternalData, /*CreateImmutableSamplers = */ true,
            [this]() //
            {
                CreateSetLayouts(/*IsSerialized*/ true);
            },
            [this]() //
            {
                return ShaderResourceCacheVk::GetRequiredMemorySize(GetNumDescriptorSets(), m_DescriptorSetSizes.data());
            });
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}